

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cc
# Opt level: O2

bool tvm::runtime::RuntimeEnabled(string *target)

{
  bool bVar1;
  PackedFunc *pPVar2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  ostream *poVar4;
  bool bVar5;
  allocator<char> local_1c9;
  string f_name;
  LogMessageFatal local_1a8;
  
  f_name._M_dataplus._M_p = (pointer)&f_name.field_2;
  f_name._M_string_length = 0;
  f_name.field_2._M_local_buf[0] = '\0';
  bVar1 = std::operator==(target,"cpu");
  bVar5 = true;
  if (bVar1) goto LAB_0010a5a4;
  bVar1 = std::operator==(target,"cuda");
  if (((((bVar1) || (bVar1 = std::operator==(target,"gpu"), bVar1)) ||
       (bVar1 = std::operator==(target,"cl"), bVar1)) ||
      ((((bVar1 = std::operator==(target,"opencl"), bVar1 ||
         (bVar1 = std::operator==(target,"sdaccel"), bVar1)) ||
        ((bVar1 = std::operator==(target,"gl"), bVar1 ||
         ((bVar1 = std::operator==(target,"opengl"), bVar1 ||
          (bVar1 = std::operator==(target,"mtl"), bVar1)))))) ||
       (bVar1 = std::operator==(target,"metal"), bVar1)))) ||
     ((((bVar1 = std::operator==(target,"vulkan"), bVar1 ||
        (bVar1 = std::operator==(target,"stackvm"), bVar1)) ||
       (bVar1 = std::operator==(target,"rpc"), bVar1)) ||
      ((bVar1 = std::operator==(target,"vpi"), bVar1 ||
       (bVar1 = std::operator==(target,"verilog"), bVar1)))))) {
LAB_0010a586:
    std::__cxx11::string::assign((char *)&f_name);
  }
  else {
    uVar3 = target->_M_string_length;
    if (4 < uVar3) {
      std::__cxx11::string::substr((ulong)&local_1a8,(ulong)target);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_1a8,"nvptx");
      std::__cxx11::string::~string((string *)&local_1a8);
      if (bVar1) goto LAB_0010a586;
      uVar3 = target->_M_string_length;
    }
    if (3 < uVar3) {
      std::__cxx11::string::substr((ulong)&local_1a8,(ulong)target);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_1a8,"rocm");
      std::__cxx11::string::~string((string *)&local_1a8);
      if (bVar1) goto LAB_0010a586;
      if (3 < target->_M_string_length) {
        std::__cxx11::string::substr((ulong)&local_1a8,(ulong)target);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&local_1a8,"llvm");
        std::__cxx11::string::~string((string *)&local_1a8);
        if (bVar1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1a8,"codegen.llvm_target_enabled",&local_1c9);
          args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Registry::Get((string *)&local_1a8);
          std::__cxx11::string::~string((string *)&local_1a8);
          if (args == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar5 = false;
          }
          else {
            PackedFunc::operator()((PackedFunc *)&local_1a8,args);
            bVar5 = TVMPODValue_::operator_cast_to_bool((TVMPODValue_ *)&local_1a8);
            TVMRetValue::~TVMRetValue((TVMRetValue *)&local_1a8);
          }
          goto LAB_0010a5a4;
        }
      }
    }
    dmlc::LogMessageFatal::LogMessageFatal
              (&local_1a8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/module.cc"
               ,0x9b);
    poVar4 = std::operator<<((ostream *)&local_1a8,"Unknown optional runtime ");
    std::operator<<(poVar4,(string *)target);
    dmlc::LogMessageFatal::~LogMessageFatal(&local_1a8);
  }
  pPVar2 = Registry::Get(&f_name);
  bVar5 = pPVar2 != (PackedFunc *)0x0;
LAB_0010a5a4:
  std::__cxx11::string::~string((string *)&f_name);
  return bVar5;
}

Assistant:

bool RuntimeEnabled(const std::string &target) {
  std::string f_name;
  if (target == "cpu") {
    return true;
  } else if (target == "cuda" || target == "gpu") {
    f_name = "device_api.gpu";
  } else if (target == "cl" || target == "opencl" || target == "sdaccel") {
    f_name = "device_api.opencl";
  } else if (target == "gl" || target == "opengl") {
    f_name = "device_api.opengl";
  } else if (target == "mtl" || target == "metal") {
    f_name = "device_api.metal";
  } else if (target == "vulkan") {
    f_name = "device_api.vulkan";
  } else if (target == "stackvm") {
    f_name = "codegen.build_stackvm";
  } else if (target == "rpc") {
    f_name = "device_api.rpc";
  } else if (target == "vpi" || target == "verilog") {
    f_name = "device_api.vpi";
  } else if (target.length() >= 5 && target.substr(0, 5) == "nvptx") {
    f_name = "device_api.gpu";
  } else if (target.length() >= 4 && target.substr(0, 4) == "rocm") {
    f_name = "device_api.rocm";
  } else if (target.length() >= 4 && target.substr(0, 4) == "llvm") {
    const PackedFunc *pf = runtime::Registry::Get("codegen.llvm_target_enabled");
    if (pf == nullptr)
      return false;
    return (*pf)(target);
  } else {
    LOG(FATAL) << "Unknown optional runtime " << target;
  }
  return runtime::Registry::Get(f_name) != nullptr;
}